

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O2

void Abc_SortMerge(int *p1Beg,int *p1End,int *p2Beg,int *p2End,int *pOut)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int *piVar7;
  int *piVar8;
  
  uVar6 = (long)p1End - (long)p1Beg;
  uVar3 = (long)p2End - (long)p2Beg;
  piVar8 = pOut;
  do {
    lVar4 = 0;
    while( true ) {
      piVar7 = (int *)((long)p1Beg + lVar4);
      if ((p1End <= piVar7) || (p2End <= p2Beg)) {
        piVar8 = (int *)((long)piVar8 + lVar4);
        lVar4 = (long)piVar8 - (long)pOut;
        for (; piVar7 < p1End; piVar7 = piVar7 + 1) {
          *piVar8 = *piVar7;
          piVar8 = piVar8 + 1;
          lVar4 = lVar4 + 4;
        }
        for (lVar5 = 0; (int *)((long)p2Beg + lVar5) < p2End; lVar5 = lVar5 + 4) {
          *(int *)((long)piVar8 + lVar5) = *(int *)((long)p2Beg + lVar5);
          lVar4 = lVar4 + 4;
        }
        if (lVar4 >> 2 == (long)((int)(uVar3 >> 2) + (int)(uVar6 >> 2))) {
          return;
        }
        __assert_fail("pOut - pOutBeg == nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilSort.c"
                      ,0x42,"void Abc_SortMerge(int *, int *, int *, int *, int *)");
      }
      iVar1 = *piVar7;
      iVar2 = *p2Beg;
      if (iVar1 == iVar2) {
        lVar5 = lVar4 + 4;
        piVar8 = (int *)((long)piVar8 + lVar4 + 8);
        piVar8[-2] = iVar1;
        piVar8[-1] = *p2Beg;
        goto LAB_003e09e7;
      }
      if (iVar2 <= iVar1) break;
      *(int *)((long)piVar8 + lVar4) = iVar1;
      lVar4 = lVar4 + 4;
    }
    piVar7 = (int *)((long)piVar8 + lVar4);
    piVar8 = piVar7 + 1;
    *piVar7 = iVar2;
    lVar5 = lVar4;
LAB_003e09e7:
    p1Beg = (int *)((long)p1Beg + lVar5);
    p2Beg = p2Beg + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Merging two lists of entries.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_SortMerge( int * p1Beg, int * p1End, int * p2Beg, int * p2End, int * pOut )
{
    int nEntries = (p1End - p1Beg) + (p2End - p2Beg);
    int * pOutBeg = pOut;
    while ( p1Beg < p1End && p2Beg < p2End )
    {
        if ( *p1Beg == *p2Beg )
            *pOut++ = *p1Beg++, *pOut++ = *p2Beg++; 
        else if ( *p1Beg < *p2Beg )
            *pOut++ = *p1Beg++; 
        else // if ( *p1Beg > *p2Beg )
            *pOut++ = *p2Beg++; 
    }
    while ( p1Beg < p1End )
        *pOut++ = *p1Beg++; 
    while ( p2Beg < p2End )
        *pOut++ = *p2Beg++;
    assert( pOut - pOutBeg == nEntries );
}